

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int POOL_tryAdd(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
  if (ctx->queueSize < 2) {
    iVar1 = 0;
    if ((ctx->numThreadsBusy == ctx->threadLimit) || (ctx->queueEmpty == 0)) goto LAB_0013eb9b;
  }
  else {
    iVar1 = 0;
    if (ctx->queueHead == (ctx->queueTail + 1) % ctx->queueSize) goto LAB_0013eb9b;
  }
  POOL_add_internal(ctx,function,opaque);
  iVar1 = 1;
LAB_0013eb9b:
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  return iVar1;
}

Assistant:

int POOL_tryAdd(POOL_ctx* ctx, POOL_function function, void* opaque)
{
    assert(ctx != NULL);
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    if (isQueueFull(ctx)) {
        ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        return 0;
    }
    POOL_add_internal(ctx, function, opaque);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return 1;
}